

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_1::ContextResetCase::iterate(ContextResetCase *this)

{
  long *plVar1;
  int *piVar2;
  ostringstream *this_00;
  ContextResetType CVar3;
  pointer pcVar4;
  TestLog *pTVar5;
  GLenum GVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  char *description;
  GLboolean isContextRobust;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> contextReset;
  RenderingContext context;
  EGLint attribList [9];
  Functions gl;
  GLboolean local_1cb9;
  undefined8 *local_1cb8;
  long *plStack_1cb0;
  long *local_1ca0 [2];
  long local_1c90 [2];
  long *local_1c80 [2];
  long local_1c70 [2];
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 local_1c50;
  Enum<int,_2UL> local_1c48;
  RenderingContext local_1c38;
  EGLint local_1c08 [6];
  undefined8 local_1bf0;
  undefined4 local_1be8;
  undefined1 local_1bd8 [120];
  ios_base local_1b60 [264];
  Functions local_1a58;
  
  glw::Functions::Functions(&local_1a58);
  local_1c08[0] = 0x3098;
  local_1c08[1] = 3;
  local_1c08[2] = 0x30fb;
  local_1c08[3] = 1;
  local_1c08[4] = 0x30bf;
  local_1c08[5] =
       (EGLint)((this->super_RobustnessTestCase).m_params.m_robustAccessType == ROBUSTACCESS_TRUE);
  local_1bf0 = 0x31bf00003138;
  local_1be8 = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1c08);
  local_1bd8._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&local_1c38,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1c08,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,(EGLContext *)local_1bd8);
  RenderingContext::makeCurrent(&local_1c38,&(this->super_RobustnessTestCase).m_eglSurface);
  RenderingContext::initGLFunctions(&local_1c38,&local_1a58);
  checkRequiredGLRobustnessExtension(local_1c08,&local_1a58);
  pcVar4 = (this->super_RobustnessTestCase).m_params.m_name._M_dataplus._M_p;
  local_1ca0[0] = local_1c90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1ca0,pcVar4,
             pcVar4 + (this->super_RobustnessTestCase).m_params.m_name._M_string_length);
  pcVar4 = (this->super_RobustnessTestCase).m_params.m_description._M_dataplus._M_p;
  local_1c80[0] = local_1c70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c80,pcVar4,
             pcVar4 + (this->super_RobustnessTestCase).m_params.m_description._M_string_length);
  local_1c50._0_4_ = (this->super_RobustnessTestCase).m_params.m_readWriteType;
  local_1c50._4_4_ = (this->super_RobustnessTestCase).m_params.m_fixedFunctionType;
  local_1c60._0_4_ = (this->super_RobustnessTestCase).m_params.m_robustAccessType;
  local_1c60._4_4_ = (this->super_RobustnessTestCase).m_params.m_contextResetType;
  uStack_1c58._0_4_ = (this->super_RobustnessTestCase).m_params.m_shaderType;
  uStack_1c58._4_4_ = (this->super_RobustnessTestCase).m_params.m_resourceType;
  pTVar5 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  if (local_1c60._4_4_ == 2) {
    puVar7 = (undefined8 *)operator_new(0x40);
    puVar7[1] = &local_1a58;
    puVar7[2] = pTVar5;
    *(undefined4 *)((long)puVar7 + 0x24) = local_1c50._4_4_;
    *puVar7 = &PTR__FixedFunctionOOB_02161e18;
    puVar7[7] = 0;
    plStack_1cb0 = (long *)0x0;
    local_1cb8 = puVar7;
    plStack_1cb0 = (long *)operator_new(0x20);
  }
  else if (local_1c60._4_4_ == 1) {
    puVar7 = (undefined8 *)operator_new(0x60);
    puVar7[1] = &local_1a58;
    puVar7[2] = pTVar5;
    puVar7[3] = uStack_1c58;
    *(undefined4 *)(puVar7 + 4) = (undefined4)local_1c50;
    *puVar7 = &PTR__ShadersOOB_02161e68;
    puVar7[7] = 0;
    puVar7[9] = 0;
    puVar7[10] = 0;
    puVar7[0xb] = 0;
    puVar8 = (undefined8 *)operator_new(0xc);
    puVar7[9] = puVar8;
    puVar7[10] = puVar8;
    puVar7[0xb] = (long)puVar8 + 0xc;
    puVar7[10] = (long)puVar8 + 0xc;
    *(bool *)(puVar7 + 8) = *(int *)((long)puVar7 + 0x1c) == 0;
    *(bool *)((long)puVar7 + 0x42) = *(int *)((long)puVar7 + 0x1c) == 2;
    *(bool *)((long)puVar7 + 0x41) = *(int *)(puVar7 + 4) == 0;
    *(undefined4 *)(puVar8 + 1) = 0;
    *puVar8 = 0;
    plStack_1cb0 = (long *)0x0;
    local_1cb8 = puVar7;
    plStack_1cb0 = (long *)operator_new(0x20);
  }
  else {
    if (local_1c60._4_4_ != 0) {
      local_1cb8 = (undefined8 *)0x0;
      plStack_1cb0 = (long *)0x0;
      plStack_1cb0 = (long *)operator_new(0x20);
      *(undefined4 *)(plStack_1cb0 + 1) = 0;
      *(undefined4 *)((long)plStack_1cb0 + 0xc) = 0;
      *plStack_1cb0 = (long)&PTR__SharedPtrState_02161dd8;
      plStack_1cb0[2] = 0;
      goto LAB_00e59f15;
    }
    puVar7 = (undefined8 *)operator_new(0x48);
    puVar7[1] = &local_1a58;
    puVar7[2] = pTVar5;
    *(undefined4 *)(puVar7 + 3) = (undefined4)uStack_1c58;
    *puVar7 = &PTR__InfiniteLoop_02161d40;
    puVar7[7] = 0;
    *(undefined4 *)(puVar7 + 8) = 0;
    plStack_1cb0 = (long *)0x0;
    local_1cb8 = puVar7;
    plStack_1cb0 = (long *)operator_new(0x20);
  }
  *(undefined4 *)(plStack_1cb0 + 1) = 0;
  *(undefined4 *)((long)plStack_1cb0 + 0xc) = 0;
  *plStack_1cb0 = (long)&PTR__SharedPtrState_02161dd8;
  plStack_1cb0[2] = (long)puVar7;
LAB_00e59f15:
  *(undefined4 *)(plStack_1cb0 + 1) = 1;
  *(undefined4 *)((long)plStack_1cb0 + 0xc) = 1;
  if (local_1c80[0] != local_1c70) {
    operator_delete(local_1c80[0],local_1c70[0] + 1);
  }
  if (local_1ca0[0] != local_1c90) {
    operator_delete(local_1ca0[0],local_1c90[0] + 1);
  }
  local_1cb9 = '\0';
  (*local_1a58.getBooleanv)(0x90f3,&local_1cb9);
  GVar6 = (*local_1a58.getError)();
  glu::checkError(GVar6,"getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &isContextRobust)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x654);
  (*(this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,&local_1cb8);
  CVar3 = (this->super_RobustnessTestCase).m_params.m_contextResetType;
  if (CVar3 - CONTEXTRESETTYPE_SHADER_OOB < 2) {
    (*(this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
      [6])(this);
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Context was NOT lost. Test skipped");
  }
  else if (CVar3 == CONTEXTRESETTYPE_INFINITE_LOOP) {
    (*(this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
      [6])(this,&local_1cb8);
    GVar6 = (*local_1a58.getGraphicsResetStatus)();
    if (GVar6 == 0) {
      description = "Context was NOT lost";
    }
    else {
      local_1bd8._0_8_ =
           ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      this_00 = (ostringstream *)(local_1bd8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"glGetGraphicsResetStatus() returned ",0x24);
      local_1c48.m_getName = glu::getGraphicsResetStatusName;
      local_1c48.m_value = GVar6;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c48,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_1b60);
      description = "Context was lost";
    }
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,(uint)(GVar6 == 0),description);
  }
  if (plStack_1cb0 != (long *)0x0) {
    LOCK();
    plVar1 = plStack_1cb0 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      local_1cb8 = (undefined8 *)0x0;
      (**(code **)(*plStack_1cb0 + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)plStack_1cb0 + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (plStack_1cb0 != (long *)0x0) {
        (**(code **)(*plStack_1cb0 + 8))();
      }
      plStack_1cb0 = (long *)0x0;
    }
  }
  RenderingContext::~RenderingContext(&local_1c38);
  return STOP;
}

Assistant:

TestCase::IterateResult ContextResetCase::iterate (void)
{
	glw::Functions	gl;

	const EGLint attribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 3,
		EGL_CONTEXT_MINOR_VERSION_KHR, 1,
		EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, (m_params.getRobustAccessType() == ROBUSTACCESS_TRUE) ? EGL_TRUE : EGL_FALSE,
		EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
		EGL_NONE
	};

	checkRequiredEGLExtensions(attribList);

	RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
	context.makeCurrent(m_eglSurface);

	context.initGLFunctions(&gl);
	checkRequiredGLRobustnessExtension(attribList, gl);

	execute(gl);

	return STOP;
}